

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManMappingVerify_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  uint Id;
  int *piVar3;
  Gia_Obj_t *pObj_00;
  long lVar4;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  iVar2 = 1;
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsAndNotBuf(pObj);
    if (iVar1 != 0) {
      iVar2 = Gia_ObjId(p,pObj);
      iVar2 = Gia_ObjIsLut(p,iVar2);
      Id = Gia_ObjId(p,pObj);
      if (iVar2 == 0) {
        iVar2 = 0;
        Abc_Print(-1,"Gia_ManMappingVerify: Internal node %d does not have mapping.\n",(ulong)Id);
      }
      else {
        iVar2 = 1;
        lVar4 = 0;
        while( true ) {
          iVar1 = Gia_ObjLutSize(p,Id);
          if (iVar1 <= lVar4) break;
          piVar3 = Gia_ObjLutFanins(p,Id);
          if (iVar2 == 0) {
            iVar2 = 0;
          }
          else {
            pObj_00 = Gia_ManObj(p,piVar3[lVar4]);
            iVar2 = Gia_ManMappingVerify_rec(p,pObj_00);
          }
          lVar4 = lVar4 + 1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int Gia_ManMappingVerify_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int Id, iFan, k, Result = 1;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 1;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( !Gia_ObjIsAndNotBuf(pObj) )
        return 1;
    if ( !Gia_ObjIsLut(p, Gia_ObjId(p, pObj)) )
    {
        Abc_Print( -1, "Gia_ManMappingVerify: Internal node %d does not have mapping.\n", Gia_ObjId(p, pObj) );
        return 0;
    }
    Id = Gia_ObjId(p, pObj);
    Gia_LutForEachFanin( p, Id, iFan, k )
        if ( Result )
            Result &= Gia_ManMappingVerify_rec( p, Gia_ManObj(p, iFan) );
    return Result;
}